

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_login_inner(amqp_connection_state_t state,char *vhost,int channel_max,int frame_max,
                int heartbeat,amqp_table_t *client_properties,timeval *timeout,
                amqp_sasl_method_enum sasl_method,__va_list_tag *vl)

{
  ushort uVar1;
  int iVar2;
  int in_ECX;
  size_t in_RSI;
  amqp_rpc_reply_t *in_RDI;
  uint in_R8D;
  int in_R9D;
  bool bVar3;
  amqp_bytes_t aVar4;
  amqp_connection_open_t s_4;
  amqp_method_number_t replies [2];
  amqp_connection_tune_ok_t s_3;
  amqp_connection_tune_t *s_2;
  amqp_method_number_t expected [3];
  amqp_bytes_t response_bytes;
  amqp_pool_t *channel_pool;
  amqp_connection_start_ok_t s_1;
  amqp_table_t client_capabilities_table;
  amqp_table_entry_t client_capabilities [2];
  amqp_table_t default_table;
  amqp_table_entry_t default_properties [6];
  amqp_connection_start_t *s;
  amqp_time_t deadline;
  amqp_rpc_reply_t result;
  uint16_t server_heartbeat;
  uint32_t server_frame_max;
  uint16_t server_channel_max;
  uint16_t client_heartbeat;
  uint32_t client_frame_max;
  uint16_t client_channel_max;
  amqp_method_t method;
  int res;
  amqp_pool_t *in_stack_fffffffffffffb58;
  amqp_method_number_t in_stack_fffffffffffffb60;
  undefined2 in_stack_fffffffffffffb64;
  amqp_channel_t in_stack_fffffffffffffb66;
  amqp_time_t in_stack_fffffffffffffb68;
  undefined1 *__dest;
  amqp_time_t in_stack_fffffffffffffb70;
  amqp_connection_state_t state_00;
  amqp_time_t *in_stack_fffffffffffffb78;
  int value_00;
  amqp_table_t *value;
  char *in_stack_fffffffffffffb80;
  void ***key;
  char *in_stack_fffffffffffffb88;
  char *value_01;
  char *in_stack_fffffffffffffb90;
  char *key_00;
  undefined8 in_stack_fffffffffffffb98;
  amqp_sasl_method_enum aVar5;
  amqp_connection_state_t state_01;
  size_t in_stack_fffffffffffffba0;
  amqp_time_t deadline_00;
  amqp_rpc_reply_t *expected_methods;
  undefined6 local_448;
  amqp_channel_t in_stack_fffffffffffffbbe;
  amqp_connection_state_t in_stack_fffffffffffffbc0;
  amqp_time_t in_stack_fffffffffffffbc8;
  amqp_pool_table_entry_t *in_stack_fffffffffffffbd0;
  amqp_pool_table_entry_t *in_stack_fffffffffffffbd8;
  amqp_method_number_t in_stack_fffffffffffffbe0;
  undefined2 in_stack_fffffffffffffbe4;
  amqp_channel_t in_stack_fffffffffffffbe6;
  undefined4 in_stack_fffffffffffffbe8;
  amqp_sasl_method_enum in_stack_fffffffffffffbec;
  amqp_time_t in_stack_fffffffffffffbf0;
  size_t local_390;
  void *local_388;
  undefined1 local_380 [40];
  undefined1 local_358 [40];
  undefined1 local_330 [40];
  undefined1 local_308 [40];
  undefined1 local_2e0 [40];
  undefined1 local_2b8 [40];
  undefined1 local_290 [40];
  undefined1 local_268 [40];
  amqp_bytes_t local_240;
  size_t local_230;
  void *local_228;
  amqp_pool_t *local_220;
  undefined8 local_218;
  undefined8 local_210;
  size_t local_208;
  void *local_200;
  size_t local_1f8;
  void *local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  undefined4 local_1d8;
  undefined1 *local_1d0;
  undefined1 local_1c8 [40];
  undefined1 auStack_1a0 [56];
  amqp_pool_table_entry_t local_168;
  char acStack_118 [40];
  char acStack_f0 [40];
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  int local_68;
  undefined4 uStack_64;
  amqp_connection_state_t local_60;
  char local_58 [8];
  amqp_pool_table_entry_t *local_50;
  ushort local_42;
  uint local_40;
  ushort local_3c;
  ushort local_3a;
  uint local_38;
  ushort local_32;
  int local_30;
  undefined4 uStack_2c;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  amqp_status_enum local_20;
  size_t local_8;
  
  aVar5 = (amqp_sasl_method_enum)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  if ((in_ECX < 0) || (0xffff < in_ECX)) {
    amqp_rpc_reply_error(in_RDI,AMQP_STATUS_INVALID_PARAMETER);
    return in_RDI;
  }
  local_32 = (ushort)in_ECX;
  if ((int)in_R8D < 0) {
    amqp_rpc_reply_error(in_RDI,AMQP_STATUS_INVALID_PARAMETER);
    return in_RDI;
  }
  if ((in_R9D < 0) || (0xffff < in_R9D)) {
    amqp_rpc_reply_error(in_RDI,AMQP_STATUS_INVALID_PARAMETER);
    return in_RDI;
  }
  local_3a = (ushort)in_R9D;
  expected_methods = in_RDI;
  local_38 = in_R8D;
  local_8 = in_RSI;
  local_20 = amqp_time_from_now(in_stack_fffffffffffffb78,
                                (timeval *)in_stack_fffffffffffffb70.time_point_ns);
  value_00 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  if (((local_20 == AMQP_STATUS_OK) &&
      (local_20 = send_header_inner((amqp_connection_state_t)
                                    CONCAT26(in_stack_fffffffffffffb66,
                                             CONCAT24(in_stack_fffffffffffffb64,
                                                      in_stack_fffffffffffffb60)),
                                    in_stack_fffffffffffffb68), local_20 == AMQP_STATUS_OK)) &&
     (local_20 = simple_wait_method_inner
                           ((amqp_connection_state_t)in_stack_fffffffffffffb68.time_point_ns,
                            in_stack_fffffffffffffb66,in_stack_fffffffffffffb60,
                            in_stack_fffffffffffffb70,(amqp_method_t *)in_stack_fffffffffffffb58),
     local_20 == AMQP_STATUS_OK)) {
    local_78 = local_28;
    cStack_77 = cStack_27;
    cStack_76 = cStack_26;
    cStack_75 = cStack_25;
    cStack_74 = cStack_24;
    cStack_73 = cStack_23;
    cStack_72 = cStack_22;
    cStack_71 = cStack_21;
    if ((*(char *)_local_28 == '\0') && (*(char *)((long)_local_28 + 1) == '\t')) {
      local_20 = amqp_table_clone((amqp_table_t *)in_stack_fffffffffffffb68.time_point_ns,
                                  (amqp_table_t *)
                                  CONCAT26(in_stack_fffffffffffffb66,
                                           CONCAT24(in_stack_fffffffffffffb64,
                                                    in_stack_fffffffffffffb60)),
                                  in_stack_fffffffffffffb58);
      if (local_20 == AMQP_STATUS_OK) {
        aVar4.bytes = in_RDI;
        aVar4.len = in_stack_fffffffffffffba0;
        iVar2 = sasl_mechanism_in_list(aVar4,aVar5);
        if (iVar2 == 0) {
          local_20 = AMQP_STATUS_BROKER_UNSUPPORTED_SASL_METHOD;
        }
        else {
          local_220 = amqp_get_or_create_channel_pool
                                ((amqp_connection_state_t)in_stack_fffffffffffffb68.time_point_ns,
                                 in_stack_fffffffffffffb66);
          if (local_220 == (amqp_pool_t *)0x0) {
            local_20 = AMQP_STATUS_NO_MEMORY;
          }
          else {
            local_240 = sasl_response((amqp_pool_t *)in_stack_fffffffffffffbf0.time_point_ns,
                                      in_stack_fffffffffffffbec,
                                      (__va_list_tag *)
                                      CONCAT26(in_stack_fffffffffffffbe6,
                                               CONCAT24(in_stack_fffffffffffffbe4,
                                                        in_stack_fffffffffffffbe0)));
            local_230 = local_240.len;
            local_228 = local_240.bytes;
            if (local_240.bytes == (void *)0x0) {
              local_20 = AMQP_STATUS_NO_MEMORY;
            }
            else {
              __dest = local_1c8;
              amqp_table_construct_bool_entry(in_stack_fffffffffffffb80,value_00);
              memcpy(__dest,local_268,0x28);
              state_00 = (amqp_connection_state_t)auStack_1a0;
              amqp_table_construct_bool_entry(in_stack_fffffffffffffb80,value_00);
              memcpy(state_00,local_290,0x28);
              local_1d0 = local_1c8;
              local_1d8 = 2;
              value = (amqp_table_t *)(auStack_1a0 + 0x38);
              amqp_table_construct_utf8_entry(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
              memcpy(value,local_2b8,0x28);
              key = &local_168.pool.large_blocks.blocklist;
              amqp_table_construct_utf8_entry(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
              memcpy(key,local_2e0,0x28);
              value_01 = acStack_118;
              amqp_table_construct_utf8_entry(in_stack_fffffffffffffb90,value_01);
              memcpy(value_01,local_308,0x28);
              key_00 = acStack_f0;
              amqp_table_construct_utf8_entry(key_00,value_01);
              memcpy(key_00,local_330,0x28);
              state_01 = (amqp_connection_state_t)&stack0xffffffffffffff38;
              amqp_table_construct_utf8_entry(key_00,value_01);
              memcpy(state_01,local_358,0x28);
              deadline_00.time_point_ns = (uint64_t)&stack0xffffffffffffff60;
              amqp_table_construct_table_entry((char *)key,value);
              aVar5 = (amqp_sasl_method_enum)((ulong)key >> 0x20);
              memcpy((void *)deadline_00.time_point_ns,local_380,0x28);
              auStack_1a0._48_8_ = auStack_1a0 + 0x38;
              auStack_1a0._40_4_ = 6;
              local_20 = amqp_merge_capabilities
                                   ((amqp_table_t *)in_stack_fffffffffffffbd8,
                                    (amqp_table_t *)in_stack_fffffffffffffbd0,
                                    (amqp_table_t *)in_stack_fffffffffffffbc8.time_point_ns,
                                    (amqp_pool_t *)in_stack_fffffffffffffbc0);
              if (local_20 == AMQP_STATUS_OK) {
                local_218 = *(undefined8 *)(local_8 + 0x140);
                local_210 = *(undefined8 *)(local_8 + 0x148);
                aVar4 = sasl_method_name(aVar5);
                local_390 = aVar4.len;
                local_208 = local_390;
                local_388 = aVar4.bytes;
                local_200 = local_388;
                local_1f8 = local_230;
                local_1f0 = local_228;
                local_1e8 = 5;
                local_1e0 = "en_US";
                local_20 = amqp_send_method_inner
                                     (state_01,(amqp_channel_t)((ulong)key_00 >> 0x30),
                                      (amqp_method_number_t)key_00,value_01,aVar5,deadline_00);
                if (AMQP_STATUS_NO_MEMORY < local_20) {
                  amqp_release_buffers(state_00);
                  local_20 = amqp_simple_wait_method_list
                                       (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbe,
                                        &expected_methods->reply_type,in_stack_fffffffffffffbc8,
                                        (amqp_method_t *)in_RDI);
                  if (local_20 == AMQP_STATUS_OK) {
                    if (local_30 == 0xa0032) {
                      _local_68 = (amqp_pool_table_entry_t *)CONCAT44(uStack_64,3);
                      local_60 = (amqp_connection_state_t)CONCAT44(uStack_2c,0xa0032);
                      local_58[0] = local_28;
                      local_58[1] = cStack_27;
                      local_58[2] = cStack_26;
                      local_58[3] = cStack_25;
                      local_58[4] = cStack_24;
                      local_58[5] = cStack_23;
                      local_58[6] = cStack_22;
                      local_58[7] = cStack_21;
                      local_50 = (amqp_pool_table_entry_t *)((ulong)local_50._4_4_ << 0x20);
                      goto LAB_00114fef;
                    }
                    local_3c = *(ushort *)_local_28;
                    local_40 = *(uint *)((long)_local_28 + 4);
                    local_42 = *(ushort *)&((amqp_pool_t *)((long)_local_28 + 8))->pagesize;
                    if ((((local_3c == 0) ||
                         ((uVar1 = local_3c, local_32 <= local_3c &&
                          (uVar1 = local_3c, local_32 != 0)))) && (uVar1 = local_32, local_3c == 0))
                       && (local_32 == 0)) {
                      local_32 = 0xffff;
                      uVar1 = local_32;
                    }
                    local_32 = uVar1;
                    if ((local_40 != 0) && (local_40 < local_38)) {
                      local_38 = local_40;
                    }
                    if ((local_42 != 0) && (local_42 < local_3a)) {
                      local_3a = local_42;
                    }
                    local_20 = amqp_tune_connection
                                         (state_01,(int)((ulong)key_00 >> 0x20),(int)key_00,
                                          (int)((ulong)value_01 >> 0x20));
                    if ((AMQP_STATUS_NO_MEMORY < local_20) &&
                       (local_20 = amqp_send_method_inner
                                             (state_01,(amqp_channel_t)((ulong)key_00 >> 0x30),
                                              (amqp_method_number_t)key_00,value_01,aVar5,
                                              deadline_00), AMQP_STATUS_NO_MEMORY < local_20)) {
                      amqp_release_buffers(state_00);
                      amqp_cstring_bytes((char *)0x114ed8);
                      simple_rpc_inner((amqp_connection_state_t)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                       ,in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0,
                                       (amqp_method_number_t *)in_stack_fffffffffffffbd8,
                                       in_stack_fffffffffffffbd0,in_stack_fffffffffffffbf0);
                      local_60 = (amqp_connection_state_t)
                                 CONCAT26(in_stack_fffffffffffffbe6,
                                          CONCAT24(in_stack_fffffffffffffbe4,
                                                   in_stack_fffffffffffffbe0));
                      local_58[4] = (char)in_stack_fffffffffffffbec;
                      local_58[5] = (char)((uint)in_stack_fffffffffffffbec >> 8);
                      local_58[6] = (char)((uint)in_stack_fffffffffffffbec >> 0x10);
                      local_58[7] = (char)((uint)in_stack_fffffffffffffbec >> 0x18);
                      local_58[0] = (char)in_stack_fffffffffffffbe8;
                      local_58[1] = (char)((uint)in_stack_fffffffffffffbe8 >> 8);
                      local_58[2] = (char)((uint)in_stack_fffffffffffffbe8 >> 0x10);
                      local_58[3] = (char)((uint)in_stack_fffffffffffffbe8 >> 0x18);
                      local_68 = (int)in_stack_fffffffffffffbd8;
                      bVar3 = local_68 == 1;
                      _local_68 = in_stack_fffffffffffffbd8;
                      local_50 = (amqp_pool_table_entry_t *)in_stack_fffffffffffffbf0.time_point_ns;
                      if (bVar3) {
                        uStack_64 = (undefined4)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
                        _local_68 = (amqp_pool_table_entry_t *)CONCAT44(uStack_64,1);
                        local_60 = (amqp_connection_state_t)((ulong)local_60 & 0xffffffff00000000);
                        local_58[0] = '\0';
                        local_58[1] = '\0';
                        local_58[2] = '\0';
                        local_58[3] = '\0';
                        local_58[4] = '\0';
                        local_58[5] = '\0';
                        local_58[6] = '\0';
                        local_58[7] = '\0';
                        local_50 = (amqp_pool_table_entry_t *)
                                   (in_stack_fffffffffffffbf0.time_point_ns & 0xffffffff00000000);
                        amqp_maybe_release_buffers((amqp_connection_state_t)0x114fef);
                      }
                      goto LAB_00114fef;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_20 = AMQP_STATUS_INCOMPATIBLE_AMQP_VERSION;
    }
  }
  amqp_socket_close((amqp_socket_t *)
                    CONCAT26(in_stack_fffffffffffffb66,
                             CONCAT24(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)),
                    (amqp_socket_close_enum)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  amqp_rpc_reply_error((amqp_rpc_reply_t *)&stack0xfffffffffffffbb8,local_20);
  _local_68 = (amqp_pool_table_entry_t *)CONCAT26(in_stack_fffffffffffffbbe,local_448);
  local_60 = in_stack_fffffffffffffbc0;
  local_58 = (char  [8])in_stack_fffffffffffffbc8.time_point_ns;
  local_50 = in_stack_fffffffffffffbd0;
LAB_00114fef:
  *(amqp_pool_table_entry_t **)in_RDI = _local_68;
  *(amqp_connection_state_t *)&in_RDI->reply = local_60;
  (in_RDI->reply).decoded = (void *)local_58;
  *(amqp_pool_table_entry_t **)&in_RDI->library_error = local_50;
  return expected_methods;
}

Assistant:

static amqp_rpc_reply_t amqp_login_inner(amqp_connection_state_t state,
                                         char const *vhost, int channel_max,
                                         int frame_max, int heartbeat,
                                         const amqp_table_t *client_properties,
                                         const struct timeval *timeout,
                                         amqp_sasl_method_enum sasl_method,
                                         va_list vl) {
  int res;
  amqp_method_t method;

  uint16_t client_channel_max;
  uint32_t client_frame_max;
  uint16_t client_heartbeat;

  uint16_t server_channel_max;
  uint32_t server_frame_max;
  uint16_t server_heartbeat;

  amqp_rpc_reply_t result;
  amqp_time_t deadline;

  if (channel_max < 0 || channel_max > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_channel_max = (uint16_t)channel_max;

  if (frame_max < 0) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_frame_max = (uint32_t)frame_max;

  if (heartbeat < 0 || heartbeat > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_heartbeat = (uint16_t)heartbeat;

  res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = send_header_inner(state, deadline);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = simple_wait_method_inner(state, 0, AMQP_CONNECTION_START_METHOD,
                                 deadline, &method);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  {
    amqp_connection_start_t *s = (amqp_connection_start_t *)method.decoded;
    if ((s->version_major != AMQP_PROTOCOL_VERSION_MAJOR) ||
        (s->version_minor != AMQP_PROTOCOL_VERSION_MINOR)) {
      res = AMQP_STATUS_INCOMPATIBLE_AMQP_VERSION;
      goto error_res;
    }

    res = amqp_table_clone(&s->server_properties, &state->server_properties,
                           &state->properties_pool);

    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    /* TODO: check that our chosen SASL mechanism is in the list of
       acceptable mechanisms. Or even let the application choose from
       the list! */
    if (!sasl_mechanism_in_list(s->mechanisms, sasl_method)) {
      res = AMQP_STATUS_BROKER_UNSUPPORTED_SASL_METHOD;
      goto error_res;
    }
  }

  {
    amqp_table_entry_t default_properties[6];
    amqp_table_t default_table;
    amqp_table_entry_t client_capabilities[2];
    amqp_table_t client_capabilities_table;
    amqp_connection_start_ok_t s;
    amqp_pool_t *channel_pool;
    amqp_bytes_t response_bytes;

    channel_pool = amqp_get_or_create_channel_pool(state, 0);
    if (NULL == channel_pool) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    response_bytes = sasl_response(channel_pool, sasl_method, vl);
    if (response_bytes.bytes == NULL) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    client_capabilities[0] =
        amqp_table_construct_bool_entry("authentication_failure_close", 1);
    client_capabilities[1] =
        amqp_table_construct_bool_entry("exchange_exchange_bindings", 1);

    client_capabilities_table.entries = client_capabilities;
    client_capabilities_table.num_entries =
        sizeof(client_capabilities) / sizeof(amqp_table_entry_t);

    default_properties[0] =
        amqp_table_construct_utf8_entry("product", "rabbitmq-c");
    default_properties[1] =
        amqp_table_construct_utf8_entry("version", AMQP_VERSION_STRING);
    default_properties[2] =
        amqp_table_construct_utf8_entry("platform", AMQ_PLATFORM);
    default_properties[3] =
        amqp_table_construct_utf8_entry("copyright", AMQ_COPYRIGHT);
    default_properties[4] = amqp_table_construct_utf8_entry(
        "information", "See https://github.com/alanxz/rabbitmq-c");
    default_properties[5] = amqp_table_construct_table_entry(
        "capabilities", &client_capabilities_table);

    default_table.entries = default_properties;
    default_table.num_entries =
        sizeof(default_properties) / sizeof(amqp_table_entry_t);

    res = amqp_merge_capabilities(&default_table, client_properties,
                                  &state->client_properties, channel_pool);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    s.client_properties = state->client_properties;
    s.mechanism = sasl_method_name(sasl_method);
    s.response = response_bytes;
    s.locale = amqp_literal_bytes("en_US");

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_START_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t expected[] = {AMQP_CONNECTION_TUNE_METHOD,
                                       AMQP_CONNECTION_CLOSE_METHOD, 0};

    res = amqp_simple_wait_method_list(state, 0, expected, deadline, &method);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }
  }

  if (AMQP_CONNECTION_CLOSE_METHOD == method.id) {
    result.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
    result.reply = method;
    result.library_error = 0;
    goto out;
  }

  {
    amqp_connection_tune_t *s = (amqp_connection_tune_t *)method.decoded;
    server_channel_max = s->channel_max;
    server_frame_max = s->frame_max;
    server_heartbeat = s->heartbeat;
  }

  if (server_channel_max != 0 &&
      (server_channel_max < client_channel_max || client_channel_max == 0)) {
    client_channel_max = server_channel_max;
  } else if (server_channel_max == 0 && client_channel_max == 0) {
    client_channel_max = UINT16_MAX;
  }

  if (server_frame_max != 0 && server_frame_max < client_frame_max) {
    client_frame_max = server_frame_max;
  }

  if (server_heartbeat != 0 && server_heartbeat < client_heartbeat) {
    client_heartbeat = server_heartbeat;
  }

  res = amqp_tune_connection(state, client_channel_max, client_frame_max,
                             client_heartbeat);
  if (res < 0) {
    goto error_res;
  }

  {
    amqp_connection_tune_ok_t s;
    s.frame_max = client_frame_max;
    s.channel_max = client_channel_max;
    s.heartbeat = client_heartbeat;

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_TUNE_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t replies[] = {AMQP_CONNECTION_OPEN_OK_METHOD, 0};
    amqp_connection_open_t s;
    s.virtual_host = amqp_cstring_bytes(vhost);
    s.capabilities = amqp_empty_bytes;
    s.insist = 1;

    result = simple_rpc_inner(state, 0, AMQP_CONNECTION_OPEN_METHOD, replies,
                              &s, deadline);
    if (result.reply_type != AMQP_RESPONSE_NORMAL) {
      goto out;
    }
  }

  result.reply_type = AMQP_RESPONSE_NORMAL;
  result.reply.id = 0;
  result.reply.decoded = NULL;
  result.library_error = 0;
  amqp_maybe_release_buffers(state);

out:
  return result;

error_res:
  amqp_socket_close(state->socket, AMQP_SC_FORCE);
  result = amqp_rpc_reply_error(res);

  goto out;
}